

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O2

uint * Ivy_ManCutTruth(Ivy_Man_t *p,Ivy_Obj_t *pRoot,Vec_Int_t *vLeaves,Vec_Int_t *vNodes,
                      Vec_Int_t *vTruth)

{
  undefined8 *puVar1;
  int *piVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  Ivy_Obj_t *pIVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  Ivy_Man_t *p_00;
  long lVar11;
  
  Ivy_ManCollectCut(p,pRoot,vLeaves,vNodes);
  for (iVar9 = 0; iVar9 < vNodes->nSize; iVar9 = iVar9 + 1) {
    iVar6 = Vec_IntEntry(vNodes,iVar9);
    pIVar7 = Ivy_ManObj(p,iVar6);
    pIVar7->TravId = iVar9;
  }
  vTruth->nSize = 0;
  Vec_IntGrow(vTruth,vNodes->nSize << 3);
  lVar8 = 0;
  for (lVar11 = 0; uVar10 = (ulong)vLeaves->nSize, lVar11 < (long)uVar10; lVar11 = lVar11 + 1) {
    Vec_IntEntry(vLeaves,(int)lVar11);
    piVar2 = vTruth->pArray;
    uVar3 = *(undefined8 *)((long)Ivy_ManCutTruth::uTruths[0] + lVar8 + 8);
    uVar4 = *(undefined8 *)((long)Ivy_ManCutTruth::uTruths[0] + lVar8 + 0x10);
    uVar5 = *(undefined8 *)((long)Ivy_ManCutTruth::uTruths[0] + lVar8 + 0x18);
    puVar1 = (undefined8 *)((long)piVar2 + lVar8);
    *puVar1 = *(undefined8 *)((long)Ivy_ManCutTruth::uTruths[0] + lVar8);
    puVar1[1] = uVar3;
    puVar1 = (undefined8 *)((long)piVar2 + lVar8 + 0x10);
    *puVar1 = uVar4;
    puVar1[1] = uVar5;
    lVar8 = lVar8 + 0x20;
  }
  while (iVar9 = (int)uVar10, iVar9 < vNodes->nSize) {
    iVar6 = Vec_IntEntry(vNodes,iVar9);
    p_00 = p;
    pIVar7 = Ivy_ManObj(p,iVar6);
    Ivy_ManCutTruthOne(p_00,pIVar7,vTruth,8);
    uVar10 = (ulong)(iVar9 + 1);
  }
  return (uint *)(vTruth->pArray + (long)pRoot->TravId * 8);
}

Assistant:

unsigned * Ivy_ManCutTruth( Ivy_Man_t * p, Ivy_Obj_t * pRoot, Vec_Int_t * vLeaves, Vec_Int_t * vNodes, Vec_Int_t * vTruth )
{
    static unsigned uTruths[8][8] = { // elementary truth tables
        { 0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA },
        { 0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC },
        { 0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0 },
        { 0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00 },
        { 0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000 }, 
        { 0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF }, 
        { 0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF,0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF }, 
        { 0x00000000,0x00000000,0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF,0xFFFFFFFF,0xFFFFFFFF } 
    };
    int i, Leaf;
    // collect the cut
    Ivy_ManCollectCut( p, pRoot, vLeaves, vNodes );
    // set the node numbers
    Vec_IntForEachEntry( vNodes, Leaf, i )
        Ivy_ManObj(p, Leaf)->TravId = i;
    // alloc enough memory
    Vec_IntClear( vTruth );
    Vec_IntGrow( vTruth, 8 * Vec_IntSize(vNodes) );
    // set the elementary truth tables
    Vec_IntForEachEntry( vLeaves, Leaf, i )
        memcpy( Ivy_ObjGetTruthStore(i, vTruth), uTruths[i], 8 * sizeof(unsigned) );
    // compute truths for other nodes
    Vec_IntForEachEntryStart( vNodes, Leaf, i, Vec_IntSize(vLeaves) )
        Ivy_ManCutTruthOne( p, Ivy_ManObj(p, Leaf), vTruth, 8 );
    return Ivy_ObjGetTruthStore( pRoot->TravId, vTruth );
}